

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSubcommandTable.cxx
# Opt level: O2

bool __thiscall
cmSubcommandTable::operator()
          (cmSubcommandTable *this,string_view key,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *status)

{
  bool bVar1;
  ulong uVar2;
  difference_type __d;
  ulong uVar3;
  pointer ppVar4;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string local_b0;
  cmAlphaNum local_90;
  cmAlphaNum local_60;
  
  ppVar4 = (this->Impl).
           super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  uVar3 = ((long)(this->Impl).
                 super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppVar4) / 0x18;
  while (uVar2 = uVar3, 0 < (long)uVar2) {
    uVar3 = uVar2 >> 1;
    __x._M_str = ppVar4[uVar3].first._M_str;
    __x._M_len = ppVar4[uVar3].first._M_len;
    bVar1 = std::operator<(__x,key);
    if (bVar1) {
      ppVar4 = ppVar4 + uVar3 + 1;
      uVar3 = ~uVar3 + uVar2;
    }
  }
  if ((ppVar4 != (this->Impl).
                 super__Vector_base<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>,_std::allocator<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_bool_(*)(const_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_&,_cmExecutionStatus_&)>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish) &&
     (bVar1 = std::operator==(ppVar4->first,key), bVar1)) {
    bVar1 = (*ppVar4->second)(args,status);
    return bVar1;
  }
  local_60.View_._M_len = 0x1f;
  local_60.View_._M_str = "does not recognize sub-command ";
  local_90.View_._M_len = key._M_len;
  local_90.View_._M_str = key._M_str;
  cmStrCat<>(&local_b0,&local_60,&local_90);
  std::__cxx11::string::_M_assign((string *)&status->Error);
  std::__cxx11::string::~string((string *)&local_b0);
  return false;
}

Assistant:

bool cmSubcommandTable::operator()(cm::string_view key,
                                   std::vector<std::string> const& args,
                                   cmExecutionStatus& status) const
{
  auto const it = std::lower_bound(
    this->Impl.begin(), this->Impl.end(), key,
    [](Elem const& elem, cm::string_view k) { return elem.first < k; });
  if (it != this->Impl.end() && it->first == key) {
    return it->second(args, status);
  }
  status.SetError(cmStrCat("does not recognize sub-command ", key));
  return false;
}